

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_string::data(xpath_string *this,xpath_allocator *alloc)

{
  size_t length;
  char_t *pcVar1;
  char_t *data_;
  size_t length_;
  xpath_allocator *alloc_local;
  xpath_string *this_local;
  
  if ((this->_uses_heap & 1U) == 0) {
    length = strlength(this->_buffer);
    pcVar1 = duplicate_string(this->_buffer,length,alloc);
    if (pcVar1 == (char_t *)0x0) {
      return (char_t *)0x0;
    }
    this->_buffer = pcVar1;
    this->_uses_heap = true;
    this->_length_heap = length;
  }
  return this->_buffer;
}

Assistant:

char_t* data(xpath_allocator* alloc)
		{
			// make private heap copy
			if (!_uses_heap)
			{
				size_t length_ = strlength(_buffer);
				const char_t* data_ = duplicate_string(_buffer, length_, alloc);

				if (!data_) return 0;

				_buffer = data_;
				_uses_heap = true;
				_length_heap = length_;
			}

			return const_cast<char_t*>(_buffer);
		}